

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_MissingContent_Test::TestBody(PKCS12Test_MissingContent_Test *this)

{
  int iVar1;
  _Head_base<0UL,_stack_st_X509_*,_false> _Var2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  char *in_R9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar4;
  EVP_PKEY *key;
  AssertHelper local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  UniquePtr<struct_stack_st_X509> certs;
  AssertionResult gtest_ar__1;
  string local_60;
  CBS cbs;
  string data;
  
  GetTestData_abi_cxx11_(&data,"crypto/pkcs8/test/bad1.p12");
  _Var2._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
  puVar4 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&cbs.len;
  cbs.len = 0;
  cbs.data = (uint8_t *)
             CONCAT71(cbs.data._1_7_,
                      (tuple<stack_st_X509_*,_bssl::internal::Deleter>)_Var2._M_head_impl !=
                      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0);
  certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)_Var2._M_head_impl;
  if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)_Var2._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&cbs,(AssertionResult *)0x527c94,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x295,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    std::__cxx11::string::~string((string *)&local_60);
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_);
LAB_003005d6:
    if (_Var3._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var3._M_head_impl + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(puVar4);
    key = (EVP_PKEY *)0x0;
    cbs.data = (uint8_t *)data._M_dataplus._M_p;
    cbs.len = data._M_string_length;
    iVar1 = PKCS12_get_key_and_certs
                      (&key,(stack_st_X509 *)
                            certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                            ._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&cbs,"");
    puVar4 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar1 == 0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(internal *)&gtest_ar__1,
                 (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &cbs, \"\")","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x298,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      std::__cxx11::string::~string((string *)&local_60);
      _Var3._M_head_impl = local_80._M_head_impl;
      goto LAB_003005d6;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(puVar4);
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&certs);
  std::__cxx11::string::~string((string *)&data);
  if ((_Head_base<0UL,_stack_st_X509_*,_false>)_Var2._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    return;
  }
  GetTestData_abi_cxx11_(&data,"crypto/pkcs8/test/bad2.p12");
  _Var2._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
  puVar4 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&cbs.len;
  cbs.len = 0;
  cbs.data = (uint8_t *)
             CONCAT71(cbs.data._1_7_,
                      (tuple<stack_st_X509_*,_bssl::internal::Deleter>)_Var2._M_head_impl !=
                      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0);
  certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)_Var2._M_head_impl;
  if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)_Var2._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&cbs,(AssertionResult *)0x527c94,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x29d,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    std::__cxx11::string::~string((string *)&local_60);
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_);
LAB_0030076a:
    if (_Var3._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var3._M_head_impl + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(puVar4);
    key = (EVP_PKEY *)0x0;
    cbs.data = (uint8_t *)data._M_dataplus._M_p;
    cbs.len = data._M_string_length;
    iVar1 = PKCS12_get_key_and_certs
                      (&key,(stack_st_X509 *)
                            certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                            ._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&cbs,"");
    puVar4 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar1 == 0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,(internal *)&gtest_ar__1,
                 (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &cbs, \"\")","true"
                 ,"false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x2a0,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      std::__cxx11::string::~string((string *)&local_60);
      _Var3._M_head_impl = local_80._M_head_impl;
      goto LAB_0030076a;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(puVar4);
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&certs);
  std::__cxx11::string::~string((string *)&data);
  if ((_Head_base<0UL,_stack_st_X509_*,_false>)_Var2._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    return;
  }
  GetTestData_abi_cxx11_(&data,"crypto/pkcs8/test/bad3.p12");
  certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)OPENSSL_sk_new_null();
  puVar4 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&cbs.len;
  cbs.len = 0;
  cbs.data = (uint8_t *)
             CONCAT71(cbs.data._1_7_,
                      (tuple<stack_st_X509_*,_bssl::internal::Deleter>)
                      certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
                      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0);
  if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
      certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl ==
      (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&cbs,(AssertionResult *)0x527c94,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x2a5,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    std::__cxx11::string::~string((string *)&local_60);
    local_80._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(puVar4);
    key = (EVP_PKEY *)0x0;
    cbs.data = (uint8_t *)data._M_dataplus._M_p;
    cbs.len = data._M_string_length;
    iVar1 = PKCS12_get_key_and_certs
                      (&key,(stack_st_X509 *)
                            certs._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>
                            ._M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&cbs,"");
    puVar4 = &gtest_ar__1.message_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar1 == 0;
    if (gtest_ar__1.success_) goto LAB_00300906;
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&gtest_ar__1,
               (AssertionResult *)"PKCS12_get_key_and_certs(&key, certs.get(), &cbs, \"\")","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x2a8,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (local_80._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
LAB_00300906:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(puVar4);
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&certs);
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

TEST(PKCS12Test, MissingContent) {
  {
    std::string data = GetTestData("crypto/pkcs8/test/bad1.p12");
    bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
    ASSERT_TRUE(certs);
    EVP_PKEY *key = nullptr;
    CBS cbs = bssl::StringAsBytes(data);
    EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &cbs, ""));
  }
  {
    std::string data = GetTestData("crypto/pkcs8/test/bad2.p12");
    bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
    ASSERT_TRUE(certs);
    EVP_PKEY *key = nullptr;
    CBS cbs = bssl::StringAsBytes(data);
    EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &cbs, ""));
  }
  {
    std::string data = GetTestData("crypto/pkcs8/test/bad3.p12");
    bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
    ASSERT_TRUE(certs);
    EVP_PKEY *key = nullptr;
    CBS cbs = bssl::StringAsBytes(data);
    EXPECT_FALSE(PKCS12_get_key_and_certs(&key, certs.get(), &cbs, ""));
  }
}